

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# address-conversion.cc
# Opt level: O2

uint64_t str2num(string *str)

{
  pointer pcVar1;
  int iVar2;
  uint64_t uVar3;
  size_t pos;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  pos = 0;
  uVar3 = 0;
  while( true ) {
    iVar2 = std::__cxx11::stoi(str,&pos,0x10);
    uVar3 = (long)iVar2 + uVar3 * 0x100;
    pos = pos + 1;
    if (pos == str->_M_string_length) break;
    pcVar1 = (str->_M_dataplus)._M_p;
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              ((string *)local_50,pcVar1 + pos,pcVar1 + str->_M_string_length);
    std::__cxx11::string::operator=((string *)str,(string *)local_50);
    std::__cxx11::string::~string((string *)local_50);
  }
  return uVar3;
}

Assistant:

uint64_t str2num(std::string str)
{
    size_t   pos    = 0;
    uint64_t result = 0;

    while (1)
    {
        result = result * 0x100 + std::stoi(str, &pos, 16);
        if (++pos == str.size())
        {
            break;
        }
        str = std::string(str.begin() + pos, str.end());
    }
    return result;
}